

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O1

void __thiscall
cmCTestCoverageHandler::WriteXMLLabels(cmCTestCoverageHandler *this,cmXMLWriter *xml,string *source)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_color _Var2;
  pointer pbVar3;
  iterator iVar4;
  _Base_ptr p_Var5;
  string local_60;
  _Rb_tree_node_base *local_40;
  cmCTestCoverageHandler *local_38;
  
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>_>
          ::find(&(this->SourceLabels)._M_t,source);
  if (((_Rb_tree_header *)iVar4._M_node != &(this->SourceLabels)._M_t._M_impl.super__Rb_tree_header)
     && (iVar4._M_node[3]._M_parent != (_Base_ptr)0x0)) {
    paVar1 = &local_60.field_2;
    local_60._M_dataplus._M_p = (pointer)paVar1;
    local_38 = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Labels","");
    cmXMLWriter::StartElement(xml,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    p_Var5 = iVar4._M_node[2]._M_right;
    if (p_Var5 != (_Base_ptr)&iVar4._M_node[2]._M_parent) {
      local_40 = (_Rb_tree_node_base *)&iVar4._M_node[2]._M_parent;
      do {
        local_60._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Label","");
        _Var2 = p_Var5[1]._M_color;
        pbVar3 = (local_38->Labels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        cmXMLWriter::StartElement(xml,&local_60);
        cmXMLWriter::Content<std::__cxx11::string>(xml,pbVar3 + (int)_Var2);
        cmXMLWriter::EndElement(xml);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != paVar1) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while (p_Var5 != local_40);
    }
    cmXMLWriter::EndElement(xml);
  }
  return;
}

Assistant:

void cmCTestCoverageHandler::WriteXMLLabels(cmXMLWriter& xml,
                                            std::string const& source)
{
  auto li = this->SourceLabels.find(source);
  if (li != this->SourceLabels.end() && !li->second.empty()) {
    xml.StartElement("Labels");
    for (auto const& ls : li->second) {
      xml.Element("Label", this->Labels[ls]);
    }
    xml.EndElement(); // Labels
  }
}